

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9GlaShrink(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *p;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  int iVar4;
  uint fUsePdr;
  char *pcVar5;
  uint fVerbose;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  
  fUsePdr = 0;
  Extra_UtilGetoptReset();
  local_40 = 1;
  local_3c = 0;
  local_48 = 0;
  local_44 = 0;
  fVerbose = 0;
LAB_00227994:
  do {
    while( true ) {
      while (iVar1 = Extra_UtilGetopt(argc,argv,"FTpsbvh"), iVar4 = globalUtilOptind, iVar1 == 0x76)
      {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar1 == -1) {
        p = pAbc->pGia;
        if (p != (Gia_Man_t *)0x0) {
          if (p->vGateClasses != (Vec_Int_t *)0x0) {
            Gia_ManShrinkGla(p,local_48,local_44,fUsePdr,local_40,local_3c,fVerbose);
            return 0;
          }
          Abc_Print(-1,"Abc_CommandAbc9GlaShrink(): There is no gate-level abstraction.\n");
          return 0;
        }
        pcVar3 = "Abc_CommandAbc9GlaShrink(): There is no AIG.\n";
        iVar4 = -1;
        goto LAB_00227ba3;
      }
      if (iVar1 != 0x73) break;
      local_40 = local_40 ^ 1;
    }
    if (iVar1 == 0x54) {
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-T\" should be followed by an integer.\n";
LAB_00227acb:
        Abc_Print(-1,pcVar3);
        goto LAB_00227ad5;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_44 = uVar2;
    }
    else {
      if (iVar1 == 0x62) {
        local_3c = local_3c ^ 1;
        goto LAB_00227994;
      }
      if (iVar1 == 0x70) {
        fUsePdr = fUsePdr ^ 1;
        goto LAB_00227994;
      }
      if (iVar1 != 0x46) goto LAB_00227ad5;
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-F\" should be followed by an integer.\n";
        goto LAB_00227acb;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_48 = uVar2;
    }
    globalUtilOptind = iVar4 + 1;
    if ((int)uVar2 < 0) {
LAB_00227ad5:
      iVar4 = -2;
      Abc_Print(-2,"usage: &gla_shrink [-FT num] [-psbvh]\n");
      Abc_Print(-2,"\t         shrinks the abstraction by removing redundant objects\n");
      Abc_Print(-2,"\t-F num : the maximum timeframe to check to [default = %d]\n",(ulong)local_48);
      Abc_Print(-2,"\t-T num : the timeout per call, in seconds [default = %d]\n",(ulong)local_44);
      pcVar5 = "yes";
      pcVar3 = "yes";
      if (fUsePdr == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-p     : toggle using PDR for checking [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_40 == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle using BMC for checking [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_3c == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-b     : toggle using BDDs for checking [default = %s]\n",pcVar3);
      if (fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
      pcVar3 = "\t-h     : print the command usage\n";
LAB_00227ba3:
      Abc_Print(iVar4,pcVar3);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9GlaShrink( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int fUsePdr = 0;
    int fUseSat = 1;
    int fUseBdd = 0;
    int nFrameMax = 0;
    int nTimeOut = 0;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FTpsbvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrameMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrameMax < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nTimeOut < 0 )
                goto usage;
            break;
        case 'p':
            fUsePdr ^= 1;
            break;
        case 's':
            fUseSat ^= 1;
            break;
        case 'b':
            fUseBdd ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9GlaShrink(): There is no AIG.\n" );
        return 1;
    }
    if ( pAbc->pGia->vGateClasses == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9GlaShrink(): There is no gate-level abstraction.\n" );
        return 0;
    }
    Gia_ManShrinkGla( pAbc->pGia, nFrameMax, nTimeOut, fUsePdr, fUseSat, fUseBdd, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &gla_shrink [-FT num] [-psbvh]\n" );
    Abc_Print( -2, "\t         shrinks the abstraction by removing redundant objects\n" );
    Abc_Print( -2, "\t-F num : the maximum timeframe to check to [default = %d]\n", nFrameMax );
    Abc_Print( -2, "\t-T num : the timeout per call, in seconds [default = %d]\n", nTimeOut );
    Abc_Print( -2, "\t-p     : toggle using PDR for checking [default = %s]\n", fUsePdr? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle using BMC for checking [default = %s]\n", fUseSat? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle using BDDs for checking [default = %s]\n", fUseBdd? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}